

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O2

void __thiscall
itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::AVLTreeNode(AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  this->right = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0;
  this->left = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  this->count = 1;
  this->height = 1;
  return;
}

Assistant:

AVLTreeNode<T>::AVLTreeNode(T value) : right(nullptr), left(nullptr), value(value), count(1), height(1) {}